

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc_sse2.c
# Opt level: O2

void aom_highbd_upsampled_pred_sse2
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,int ref_stride,
               int bd,int subpel_search)

{
  undefined8 *puVar1;
  buf_2d *pbVar2;
  int *piVar3;
  undefined8 uVar4;
  ushort uVar5;
  undefined4 uVar6;
  int iVar7;
  InterpFilterParams *pIVar8;
  long *plVar9;
  undefined4 *puVar10;
  undefined8 *puVar11;
  short sVar12;
  uint uVar13;
  long lVar14;
  scale_factors *sf;
  undefined4 *puVar15;
  InterpFilterParams *pIVar16;
  bool bVar17;
  undefined1 auStackY_a138 [168];
  undefined8 uStackY_a090;
  uint16_t temp [20480];
  
  if (xd != (MACROBLOCKD *)0x0) {
    uVar5 = *(ushort *)&(*xd->mi)->field_0xa7 >> 7;
    uVar13 = uVar5 & 1;
    if ((uVar5 & 1) == 0) {
      sf = xd->block_ref_scale_factors[0];
    }
    else {
      sf = &cm->sf_identity;
    }
    iVar7 = av1_is_scaled(sf);
    if (iVar7 != 0) {
      pIVar16 = av1_interp_filter_params_list;
      pIVar8 = av1_interp_filter_params_list;
      if (height < 5) {
        pIVar8 = av1_interp_4tap;
      }
      sVar12 = (short)uVar13;
      if (sVar12 != 0) {
        pIVar8 = &av1_intrabc_filter_params;
      }
      if (width < 5) {
        pIVar16 = av1_interp_4tap;
      }
      bVar17 = sVar12 == 0;
      if (!bVar17) {
        pIVar16 = &av1_intrabc_filter_params;
      }
      temp._176_4_ = xd->bd;
      temp._68_4_ = 3;
      if (10 < (int)temp._176_4_) {
        temp._68_4_ = temp._176_4_ + -7;
      }
      temp._72_4_ = 0xb;
      if (10 < (int)temp._176_4_) {
        temp._72_4_ = 0x15 - temp._176_4_;
      }
      temp[0x18] = 0;
      temp[0x19] = 0;
      temp[0x1c] = 0;
      temp[0x1d] = 0;
      temp[0x1e] = 0;
      temp[0x1f] = 0;
      temp[0x20] = 0;
      temp[0x21] = 0;
      temp[0x26] = 0;
      temp[0x27] = 0;
      temp[0x28] = 0;
      temp[0x29] = 0;
      temp[0x2a] = 0;
      temp[0x2b] = 0;
      temp._160_4_ = xd->plane[0].subsampling_x;
      temp._164_4_ = xd->plane[0].subsampling_y;
      temp._112_4_ = width;
      temp._116_4_ = height;
      temp._120_4_ = (mi_row << 2) >> ((byte)temp._164_4_ & 0x1f);
      temp._124_4_ = (mi_col << 2) >> ((byte)temp._160_4_ & 0x1f);
      temp._180_4_ = (uint)xd->cur_buf->flags >> 3 & 1;
      temp[0] = 0;
      temp[1] = 0;
      temp[2] = 0;
      temp[3] = 0;
      temp._208_4_ = (0x120U >> ((byte)temp._164_4_ & 0x1f)) * -0x400 + 0x1000;
      temp._212_4_ = (0x120U >> ((byte)temp._160_4_ & 0x1f)) * -0x400 + 0x1000;
      pbVar2 = xd->plane[0].pre + ((ulong)bVar17 - 1);
      temp._128_8_ = pbVar2->buf;
      temp._136_8_ = pbVar2->buf0;
      piVar3 = &xd->plane[0].pre[(ulong)bVar17 - 1].width;
      temp._144_8_ = *(undefined8 *)piVar3;
      temp._152_8_ = *(undefined8 *)(piVar3 + 2);
      temp._96_8_ = pIVar16;
      temp._104_8_ = pIVar8;
      temp._168_8_ = sf;
      temp._204_4_ = uVar13;
      av1_enc_build_one_inter_predictor(comp_pred8,width,mv,(InterPredParams *)temp);
      return;
    }
  }
  if (subpel_search - 1U < 3) {
    plVar9 = *(long **)(&DAT_005507d0 + (ulong)(subpel_search - 1U) * 8);
  }
  else {
    plVar9 = (long *)0x0;
  }
  if (subpel_y_q3 == 0 && subpel_x_q3 == 0) {
    puVar15 = (undefined4 *)((long)ref8 * 2);
    puVar11 = (undefined8 *)((long)comp_pred8 * 2);
    if (width < 8) {
      for (lVar14 = 0; (int)lVar14 < height; lVar14 = lVar14 + 2) {
        uVar4 = *(undefined8 *)((long)puVar15 + (long)ref_stride * 2);
        uVar6 = puVar15[1];
        puVar1 = puVar11 + lVar14;
        *(undefined4 *)puVar1 = *puVar15;
        *(undefined4 *)((long)puVar1 + 4) = uVar6;
        *(int *)(puVar1 + 1) = (int)uVar4;
        *(int *)((long)puVar1 + 0xc) = (int)((ulong)uVar4 >> 0x20);
        puVar15 = (undefined4 *)((long)puVar15 + (long)(ref_stride * 2) * 2);
      }
    }
    else {
      iVar7 = 0;
      if (height < 1) {
        height = 0;
      }
      for (; iVar7 != height; iVar7 = iVar7 + 1) {
        puVar10 = (undefined4 *)((long)puVar15 + (long)ref_stride * 2 + (long)width * -2);
        for (lVar14 = 0; (int)lVar14 < width; lVar14 = lVar14 + 8) {
          puVar1 = (undefined8 *)((long)puVar15 + lVar14 * 2);
          uVar4 = puVar1[1];
          *puVar11 = *puVar1;
          puVar11[1] = uVar4;
          puVar11 = puVar11 + 2;
          puVar10 = puVar10 + 4;
        }
        puVar15 = puVar10;
      }
    }
  }
  else if (subpel_y_q3 == 0) {
    uStackY_a090 = 0x225c2a;
    (*aom_highbd_convolve8_horiz)
              (ref8,(long)ref_stride,comp_pred8,(long)width,
               (int16_t *)((long)(subpel_x_q3 * 2) * (ulong)*(ushort *)(plVar9 + 1) * 2 + *plVar9),
               0x10,(int16_t *)0x0,-1,width,height,bd);
  }
  else if (subpel_x_q3 == 0) {
    uStackY_a090 = 0x225c95;
    (*aom_highbd_convolve8_vert)
              (ref8,(long)ref_stride,comp_pred8,(long)width,(int16_t *)0x0,-1,
               (int16_t *)((long)(subpel_y_q3 * 2) * (ulong)*(ushort *)(plVar9 + 1) * 2 + *plVar9),
               0x10,width,height,bd);
  }
  else {
    uVar13 = (uint)(2 < subpel_search) * 4 + 4;
    lVar14 = *plVar9;
    uVar5 = *(ushort *)(plVar9 + 1);
    uStackY_a090 = 0x225b59;
    (*aom_highbd_convolve8_horiz)
              (ref8 + -(long)(int)(((uVar13 >> 1) - 1) * ref_stride),(long)ref_stride,
               (uint8_t *)((ulong)(temp + (ulong)(subpel_search < 3) * 0x100) >> 1),0x80,
               (int16_t *)(lVar14 + (long)(subpel_x_q3 * 2) * (ulong)uVar5 * 2),0x10,(int16_t *)0x0,
               -1,width,(subpel_y_q3 + height * 8 + -8 >> 3) + uVar13,bd);
    uStackY_a090 = 0x225b93;
    (*aom_highbd_convolve8_vert)
              ((uint8_t *)((ulong)(auStackY_a138 + ((uVar5 & 0xfffe) << 7)) >> 1),0x80,comp_pred8,
               (long)width,(int16_t *)0x0,-1,
               (int16_t *)(lVar14 + (long)(subpel_y_q3 * 2) * (ulong)uVar5 * 2),0x10,width,height,bd
              );
  }
  return;
}

Assistant:

void aom_highbd_upsampled_pred_sse2(MACROBLOCKD *xd,
                                    const struct AV1Common *const cm,
                                    int mi_row, int mi_col, const MV *const mv,
                                    uint8_t *comp_pred8, int width, int height,
                                    int subpel_x_q3, int subpel_y_q3,
                                    const uint8_t *ref8, int ref_stride, int bd,
                                    int subpel_search) {
  // expect xd == NULL only in tests
  if (xd != NULL) {
    const MB_MODE_INFO *mi = xd->mi[0];
    const int ref_num = 0;
    const int is_intrabc = is_intrabc_block(mi);
    const struct scale_factors *const sf =
        is_intrabc ? &cm->sf_identity : xd->block_ref_scale_factors[ref_num];
    const int is_scaled = av1_is_scaled(sf);

    if (is_scaled) {
      int plane = 0;
      const int mi_x = mi_col * MI_SIZE;
      const int mi_y = mi_row * MI_SIZE;
      const struct macroblockd_plane *const pd = &xd->plane[plane];
      const struct buf_2d *const dst_buf = &pd->dst;
      const struct buf_2d *const pre_buf =
          is_intrabc ? dst_buf : &pd->pre[ref_num];

      InterPredParams inter_pred_params;
      inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
      const int_interpfilters filters =
          av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      av1_init_inter_params(
          &inter_pred_params, width, height, mi_y >> pd->subsampling_y,
          mi_x >> pd->subsampling_x, pd->subsampling_x, pd->subsampling_y,
          xd->bd, is_cur_buf_hbd(xd), is_intrabc, sf, pre_buf, filters);
      av1_enc_build_one_inter_predictor(comp_pred8, width, mv,
                                        &inter_pred_params);
      return;
    }
  }

  const InterpFilterParams *filter = av1_get_filter(subpel_search);
  int filter_taps = (subpel_search <= USE_4_TAPS) ? 4 : SUBPEL_TAPS;
  if (!subpel_x_q3 && !subpel_y_q3) {
    uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
    uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
    if (width >= 8) {
      int i;
      assert(!(width & 7));
      /*Read 8 pixels one row at a time.*/
      for (i = 0; i < height; i++) {
        int j;
        for (j = 0; j < width; j += 8) {
          __m128i s0 = _mm_loadu_si128((const __m128i *)ref);
          _mm_storeu_si128((__m128i *)comp_pred, s0);
          comp_pred += 8;
          ref += 8;
        }
        ref += ref_stride - width;
      }
    } else {
      int i;
      assert(!(width & 3));
      /*Read 4 pixels two rows at a time.*/
      for (i = 0; i < height; i += 2) {
        __m128i s0 = _mm_loadl_epi64((const __m128i *)ref);
        __m128i s1 = _mm_loadl_epi64((const __m128i *)(ref + ref_stride));
        __m128i t0 = _mm_unpacklo_epi64(s0, s1);
        _mm_storeu_si128((__m128i *)comp_pred, t0);
        comp_pred += 8;
        ref += 2 * ref_stride;
      }
    }
  } else if (!subpel_y_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    aom_highbd_convolve8_horiz(ref8, ref_stride, comp_pred8, width, kernel, 16,
                               NULL, -1, width, height, bd);
  } else if (!subpel_x_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    aom_highbd_convolve8_vert(ref8, ref_stride, comp_pred8, width, NULL, -1,
                              kernel, 16, width, height, bd);
  } else {
    DECLARE_ALIGNED(16, uint16_t,
                    temp[((MAX_SB_SIZE + 16) + 16) * MAX_SB_SIZE]);
    const int16_t *const kernel_x =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    const int16_t *const kernel_y =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    const uint8_t *ref_start = ref8 - ref_stride * ((filter_taps >> 1) - 1);
    uint16_t *temp_start_horiz = (subpel_search <= USE_4_TAPS)
                                     ? temp + (filter_taps >> 1) * MAX_SB_SIZE
                                     : temp;
    uint16_t *temp_start_vert = temp + MAX_SB_SIZE * ((filter->taps >> 1) - 1);
    const int intermediate_height =
        (((height - 1) * 8 + subpel_y_q3) >> 3) + filter_taps;
    assert(intermediate_height <= (MAX_SB_SIZE * 2 + 16) + 16);
    aom_highbd_convolve8_horiz(
        ref_start, ref_stride, CONVERT_TO_BYTEPTR(temp_start_horiz),
        MAX_SB_SIZE, kernel_x, 16, NULL, -1, width, intermediate_height, bd);
    aom_highbd_convolve8_vert(CONVERT_TO_BYTEPTR(temp_start_vert), MAX_SB_SIZE,
                              comp_pred8, width, NULL, -1, kernel_y, 16, width,
                              height, bd);
  }
}